

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

sqlite3_pcache * pcache1Create(int szPage,int szExtra,int bPurgeable)

{
  sqlite3_mutex *psVar1;
  int iVar2;
  uint uVar3;
  sqlite3_pcache *__s;
  PCacheGlobal *pPVar4;
  
  iVar2 = sqlite3Config.bCoreMutex;
  uVar3 = 0x38;
  if (0 < sqlite3Config.bCoreMutex) {
    uVar3 = 0x60;
  }
  __s = (sqlite3_pcache *)sqlite3Malloc(uVar3);
  if (__s != (sqlite3_pcache *)0x0) {
    memset(__s,0,(ulong)uVar3);
    if (iVar2 < 1) {
      pPVar4 = &pcache1_g;
    }
    else {
      pPVar4 = (PCacheGlobal *)(__s + 0x38);
      *(undefined4 *)(__s + 0x48) = 10;
    }
    *(PCacheGlobal **)__s = pPVar4;
    *(int *)(__s + 8) = szPage;
    *(int *)(__s + 0xc) = szExtra;
    *(uint *)(__s + 0x10) = (uint)(bPurgeable != 0);
    if (bPurgeable != 0) {
      *(undefined4 *)(__s + 0x14) = 10;
      psVar1 = (pPVar4->grp).mutex;
      if (psVar1 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(psVar1);
      }
      uVar3 = (pPVar4->grp).nMinPage + *(int *)(__s + 0x14);
      (pPVar4->grp).nMinPage = uVar3;
      (pPVar4->grp).mxPinned = ((pPVar4->grp).nMaxPage - uVar3) + 10;
      psVar1 = (pPVar4->grp).mutex;
      if (psVar1 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(psVar1);
      }
    }
  }
  return __s;
}

Assistant:

static sqlite3_pcache *pcache1Create(int szPage, int szExtra, int bPurgeable){
  PCache1 *pCache;      /* The newly created page cache */
  PGroup *pGroup;       /* The group the new page cache will belong to */
  int sz;               /* Bytes of memory required to allocate the new cache */

  /*
  ** The seperateCache variable is true if each PCache has its own private
  ** PGroup.  In other words, separateCache is true for mode (1) where no
  ** mutexing is required.
  **
  **   *  Always use a unified cache (mode-2) if ENABLE_MEMORY_MANAGEMENT
  **
  **   *  Always use a unified cache in single-threaded applications
  **
  **   *  Otherwise (if multi-threaded and ENABLE_MEMORY_MANAGEMENT is off)
  **      use separate caches (mode-1)
  */
#if defined(SQLITE_ENABLE_MEMORY_MANAGEMENT) || SQLITE_THREADSAFE==0
  const int separateCache = 0;
#else
  int separateCache = sqlite3GlobalConfig.bCoreMutex>0;
#endif

  assert( (szPage & (szPage-1))==0 && szPage>=512 && szPage<=65536 );
  assert( szExtra < 300 );

  sz = sizeof(PCache1) + sizeof(PGroup)*separateCache;
  pCache = (PCache1 *)sqlite3MallocZero(sz);
  if( pCache ){
    if( separateCache ){
      pGroup = (PGroup*)&pCache[1];
      pGroup->mxPinned = 10;
    }else{
      pGroup = &pcache1.grp;
    }
    pCache->pGroup = pGroup;
    pCache->szPage = szPage;
    pCache->szExtra = szExtra;
    pCache->bPurgeable = (bPurgeable ? 1 : 0);
    if( bPurgeable ){
      pCache->nMin = 10;
      pcache1EnterMutex(pGroup);
      pGroup->nMinPage += pCache->nMin;
      pGroup->mxPinned = pGroup->nMaxPage + 10 - pGroup->nMinPage;
      pcache1LeaveMutex(pGroup);
    }
  }
  return (sqlite3_pcache *)pCache;
}